

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O0

int IDASetPreconditioner(void *ida_mem,IDALsPrecSetupFn psetup,IDALsPrecSolveFn psolve)

{
  int iVar1;
  code *pcVar2;
  code *pcVar3;
  long in_RDX;
  long in_RSI;
  int retval;
  SUNPSolveFn idals_psolve;
  SUNPSetupFn idals_psetup;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  long local_30;
  IDAMem local_28;
  int local_4;
  
  local_4 = idaLs_AccessLMem(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                             (IDAMem *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                             ,(IDALsMem *)0x134b0e);
  if (local_4 == 0) {
    *(long *)(local_30 + 0x100) = in_RSI;
    *(long *)(local_30 + 0x108) = in_RDX;
    if (*(long *)(*(long *)(*(long *)(local_30 + 0x20) + 8) + 0x18) == 0) {
      IDAProcessError(local_28,-3,0x1e9,"IDASetPreconditioner",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                      ,"SUNLinearSolver object does not support user-supplied preconditioning");
      local_4 = -3;
    }
    else {
      pcVar2 = idaLsPSetup;
      if (in_RSI == 0) {
        pcVar2 = (code *)0x0;
      }
      pcVar3 = idaLsPSolve;
      if (in_RDX == 0) {
        pcVar3 = (code *)0x0;
      }
      iVar1 = SUNLinSolSetPreconditioner(*(undefined8 *)(local_30 + 0x20),local_28,pcVar2,pcVar3);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        IDAProcessError(local_28,-9,0x1f6,"IDASetPreconditioner",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_ls.c"
                        ,"Error in calling SUNLinSolSetPreconditioner");
        local_4 = -9;
      }
    }
  }
  return local_4;
}

Assistant:

int IDASetPreconditioner(void* ida_mem, IDALsPrecSetupFn psetup,
                         IDALsPrecSolveFn psolve)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  SUNPSetupFn idals_psetup;
  SUNPSolveFn idals_psolve;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* store function pointers for user-supplied routines in IDALs interface */
  idals_mem->pset   = psetup;
  idals_mem->psolve = psolve;

  /* issue error if LS object does not allow user-supplied preconditioning */
  if (idals_mem->LS->ops->setpreconditioner == NULL)
  {
    IDAProcessError(IDA_mem, IDALS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "SUNLinearSolver object does not support user-supplied "
                    "preconditioning");
    return (IDALS_ILL_INPUT);
  }

  /* notify iterative linear solver to call IDALs interface routines */
  idals_psetup = (psetup == NULL) ? NULL : idaLsPSetup;
  idals_psolve = (psolve == NULL) ? NULL : idaLsPSolve;
  retval = SUNLinSolSetPreconditioner(idals_mem->LS, IDA_mem, idals_psetup,
                                      idals_psolve);
  if (retval != SUN_SUCCESS)
  {
    IDAProcessError(IDA_mem, IDALS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    "Error in calling SUNLinSolSetPreconditioner");
    return (IDALS_SUNLS_FAIL);
  }

  return (IDALS_SUCCESS);
}